

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O2

void remora::bindings::mgemm<double,double,remora::bindings::gemm_block_size<double>>
               (double alpha,ulong mc,ulong nc,size_t kc,long A,long B,double *C,size_t stride1,
               size_t stride2)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double *B_00;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double CTempBlock [24];
  
  uVar9 = 0;
  uVar7 = nc;
  pdVar10 = C;
  while( true ) {
    uVar5 = 6;
    if (uVar7 < 6) {
      uVar5 = uVar7;
    }
    if (uVar9 == (nc + 5) / 6) break;
    B_00 = (double *)(kc * 0x30 * uVar9 + B);
    uVar13 = 0;
    pdVar11 = pdVar10;
    uVar12 = mc;
    while( true ) {
      uVar14 = 4;
      if (uVar12 < 4) {
        uVar14 = uVar12;
      }
      if (uVar13 == mc + 3 >> 2) break;
      if (mc + uVar13 * -4 < 4 || nc + uVar9 * -6 < 6) {
        for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 8) {
          *(undefined8 *)((long)CTempBlock + lVar1) = 0;
        }
        ugemm<remora::bindings::gemm_block_size<double>,double,double>
                  (kc,alpha,(double *)(kc * 0x20 * uVar13 + A),B_00,CTempBlock,6,1);
        pdVar3 = CTempBlock;
        pdVar2 = pdVar11;
        for (uVar4 = 0; uVar4 != uVar14; uVar4 = uVar4 + 1) {
          pdVar6 = pdVar2;
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            *pdVar6 = pdVar3[uVar8] + *pdVar6;
            pdVar6 = pdVar6 + stride2;
          }
          pdVar3 = pdVar3 + 6;
          pdVar2 = pdVar2 + stride1;
        }
      }
      else {
        ugemm<remora::bindings::gemm_block_size<double>,double,double>
                  (kc,alpha,(double *)(kc * 0x20 * uVar13 + A),B_00,
                   C + uVar9 * 6 * stride2 + uVar13 * 4 * stride1,stride1,stride2);
      }
      uVar13 = uVar13 + 1;
      uVar12 = uVar12 - 4;
      pdVar11 = pdVar11 + stride1 * 4;
    }
    uVar9 = uVar9 + 1;
    uVar7 = uVar7 - 6;
    pdVar10 = pdVar10 + stride2 * 6;
  }
  return;
}

Assistant:

void mgemm(
	std::size_t mc, std::size_t nc, std::size_t kc, TC alpha,
	T const* A, T const* B, TC *C,
	std::size_t stride1, std::size_t stride2, block_size
){
	static std::size_t const MR = block_size::mr;
	static std::size_t const NR = block_size::nr;
	std::size_t const mp  = (mc+MR-1) / MR;
	std::size_t const np  = (nc+NR-1) / NR;

	for (std::size_t j=0; j<np; ++j) {
		std::size_t const nr = std::min(NR, nc - j*NR);

		for (std::size_t i=0; i<mp; ++i) {
			std::size_t const mr = std::min(MR, mc - i*MR);
			auto CBlockStart = C+i*MR*stride1+j*NR*stride2;
			if (mr==MR && nr==NR) {
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CBlockStart, stride1, stride2
				);
			} else {
				TC CTempBlock[MR*NR];
				std::fill_n(CTempBlock, MR*NR, T(0));
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CTempBlock, NR, 1
				);

				for (std::size_t i0=0; i0<mr; ++i0){
					for (std::size_t j0=0; j0<nr; ++j0) {
						CBlockStart[i0*stride1+j0 * stride2] += CTempBlock[i0*NR+j0];
					}
				}
			}
		}
	}
}